

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O2

int CVodeGetSensDky1(void *cvode_mem,sunrealtype t,int k,int is,N_Vector dkyS)

{
  double dVar1;
  double dVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  char *msgfmt;
  uint uVar8;
  bool bVar9;
  double dVar10;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    iVar7 = -0x15;
    cvode_mem = (CVodeMem)0x0;
    iVar5 = 0xfec;
  }
  else if (*(int *)((long)cvode_mem + 0x8c) == 1) {
    if (dkyS == (N_Vector)0x0) {
      msgfmt = "dky = NULL illegal.";
      iVar7 = -0x1a;
      iVar5 = 0xffd;
    }
    else {
      if (-1 < k) {
        uVar4 = *(uint *)((long)cvode_mem + 0x3c0);
        iVar5 = uVar4 - k;
        if (k <= (int)uVar4) {
          if ((is < 0) || (*(int *)((long)cvode_mem + 0x90) <= is)) {
            msgfmt = "Illegal value for is.";
            iVar7 = -0x2d;
            iVar5 = 0x100c;
          }
          else {
            dVar1 = *(double *)((long)cvode_mem + 0x408);
            dVar2 = *(double *)((long)cvode_mem + 0x810);
            dVar10 = (ABS(dVar2) + ABS(dVar1)) * *(double *)((long)cvode_mem + 8) * 100.0;
            dVar10 = (double)(-(ulong)(dVar2 < 0.0) & (ulong)-dVar10 |
                             ~-(ulong)(dVar2 < 0.0) & (ulong)dVar10);
            if ((t - (dVar10 + dVar1)) * (t - ((dVar1 - dVar2) - dVar10)) <= 0.0) {
              dVar2 = *(double *)((long)cvode_mem + 0x3e0);
              lVar6 = 0;
              while( true ) {
                iVar7 = 0;
                if (0 < iVar5) {
                  iVar7 = iVar5;
                }
                if ((int)uVar4 < k) break;
                lVar3 = *(long *)((long)cvode_mem + 0xa50);
                *(undefined8 *)(lVar3 + lVar6 * 8) = 0x3ff0000000000000;
                dVar10 = 1.0;
                for (uVar8 = uVar4; (int)(uVar4 - k) < (int)uVar8; uVar8 = uVar8 - 1) {
                  dVar10 = dVar10 * (double)(int)uVar8;
                  *(double *)(lVar3 + lVar6 * 8) = dVar10;
                }
                while (bVar9 = iVar7 != 0, iVar7 = iVar7 + -1, bVar9) {
                  dVar10 = dVar10 * ((t - dVar1) / dVar2);
                  *(double *)(lVar3 + lVar6 * 8) = dVar10;
                }
                *(undefined8 *)(*(long *)((long)cvode_mem + 0xa58) + lVar6 * 8) =
                     *(undefined8 *)
                      (*(long *)((long)cvode_mem + (ulong)uVar4 * 8 + 0x288) + (ulong)(uint)is * 8);
                lVar6 = lVar6 + 1;
                uVar4 = uVar4 - 1;
                iVar5 = iVar5 + -1;
              }
              iVar5 = N_VLinearCombination
                                (lVar6,*(undefined8 *)((long)cvode_mem + 0xa50),
                                 *(undefined8 *)((long)cvode_mem + 0xa58),dkyS);
              if (iVar5 != 0) {
                return -0x1c;
              }
              if (k == 0) {
                return 0;
              }
              SUNRpowerI(*(undefined8 *)((long)cvode_mem + 0x3e0),-k);
              N_VScale(dkyS,dkyS);
              return 0;
            }
            msgfmt = "Illegal value for t.t = %lg is not between tcur - hu = %lg and tcur = %lg.";
            iVar7 = -0x19;
            iVar5 = 0x1019;
          }
          goto LAB_0011cb1a;
        }
      }
      msgfmt = "Illegal value for k.";
      iVar7 = -0x18;
      iVar5 = 0x1005;
    }
  }
  else {
    msgfmt = "Forward sensitivity analysis not activated.";
    iVar7 = -0x28;
    iVar5 = 0xff5;
  }
LAB_0011cb1a:
  cvProcessError((CVodeMem)cvode_mem,iVar7,iVar5,"CVodeGetSensDky1",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                 ,msgfmt);
  return iVar7;
}

Assistant:

int CVodeGetSensDky1(void* cvode_mem, sunrealtype t, int k, int is, N_Vector dkyS)
{
  sunrealtype s, r;
  sunrealtype tfuzz, tp, tn1;
  int i, j, nvec, ier;
  CVodeMem cv_mem;

  /* Check all inputs for legality */

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(CV_PROFILER);

  if (cv_mem->cv_sensi != SUNTRUE)
  {
    cvProcessError(cv_mem, CV_NO_SENS, __LINE__, __func__, __FILE__,
                   MSGCV_NO_SENSI);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_NO_SENS);
  }

  if (dkyS == NULL)
  {
    cvProcessError(cv_mem, CV_BAD_DKY, __LINE__, __func__, __FILE__,
                   MSGCV_NULL_DKY);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_BAD_DKY);
  }

  if ((k < 0) || (k > cv_mem->cv_q))
  {
    cvProcessError(cv_mem, CV_BAD_K, __LINE__, __func__, __FILE__, MSGCV_BAD_K);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_BAD_K);
  }

  if ((is < 0) || (is > cv_mem->cv_Ns - 1))
  {
    cvProcessError(cv_mem, CV_BAD_IS, __LINE__, __func__, __FILE__, MSGCV_BAD_IS);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_BAD_IS);
  }

  /* Allow for some slack */
  tfuzz = FUZZ_FACTOR * cv_mem->cv_uround *
          (SUNRabs(cv_mem->cv_tn) + SUNRabs(cv_mem->cv_hu));
  if (cv_mem->cv_hu < ZERO) { tfuzz = -tfuzz; }
  tp  = cv_mem->cv_tn - cv_mem->cv_hu - tfuzz;
  tn1 = cv_mem->cv_tn + tfuzz;
  if ((t - tp) * (t - tn1) > ZERO)
  {
    cvProcessError(cv_mem, CV_BAD_T, __LINE__, __func__, __FILE__, MSGCV_BAD_T);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_BAD_T);
  }

  /* Sum the differentiated interpolating polynomial */
  nvec = 0;

  s = (t - cv_mem->cv_tn) / cv_mem->cv_h;
  for (j = cv_mem->cv_q; j >= k; j--)
  {
    cv_mem->cv_cvals[nvec] = ONE;
    for (i = j; i >= j - k + 1; i--) { cv_mem->cv_cvals[nvec] *= i; }
    for (i = 0; i < j - k; i++) { cv_mem->cv_cvals[nvec] *= s; }
    cv_mem->cv_Xvecs[nvec] = cv_mem->cv_znS[j][is];
    nvec += 1;
  }
  ier = N_VLinearCombination(nvec, cv_mem->cv_cvals, cv_mem->cv_Xvecs, dkyS);
  if (ier != CV_SUCCESS)
  {
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_VECTOROP_ERR);
  }

  if (k == 0)
  {
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_SUCCESS);
  }
  r = SUNRpowerI(cv_mem->cv_h, -k);
  N_VScale(r, dkyS, dkyS);

  SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
  return (CV_SUCCESS);
}